

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  PosixFileLock *this_local;
  
  (this->super_FileLock)._vptr_FileLock = (_func_int **)&PTR__PosixFileLock_001e5d38;
  std::__cxx11::string::~string((string *)&this->filename_);
  FileLock::~FileLock(&this->super_FileLock);
  return;
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}